

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O1

my_rational my_rational_sum(my_rational *a,my_rational *b)

{
  _Bool _Var1;
  wchar_t wVar2;
  size_t sVar3;
  ushort *puVar4;
  size_t sVar5;
  my_rational mVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint t;
  int iVar15;
  int iVar16;
  bool bVar17;
  uint16_t a_u16n [2];
  uint16_t q_u16n [2];
  uint16_t b_u16n [2];
  uint16_t d_u16n [4];
  uint16_t n_u16n [5];
  uint16_t sr_u16n [7];
  uint16_t w_u16n [5];
  uint16_t r_u16n [5];
  uint16_t rr_u16n [7];
  
  uVar10 = b->d;
  uVar12 = a->d;
  uVar13 = uVar10;
  while (uVar13 != 0) {
    uVar9 = uVar12 % uVar13;
    uVar12 = uVar13;
    uVar13 = uVar9;
  }
  uVar11 = (ulong)a->d / (ulong)uVar12;
  uVar8 = (ulong)uVar10 / (ulong)uVar12;
  if ((int)(uVar10 * uVar11 >> 0x20) == 0) {
    if ((int)(uVar8 * a->n >> 0x20) == 0) {
      if (((int)(uVar11 * b->n >> 0x20) == 0) &&
         (uVar9 = a->n * (int)uVar8, uVar12 = b->n * (int)uVar11, uVar13 = uVar12 + uVar9,
         !CARRY4(uVar12,uVar9))) {
        uVar10 = (int)uVar11 * uVar10;
        goto LAB_001fcc6f;
      }
    }
  }
  lVar7 = 1;
  uVar10 = a->n;
  do {
    uVar12 = uVar10;
    a_u16n[lVar7] = (uint16_t)uVar12;
    bVar17 = lVar7 != 0;
    lVar7 = lVar7 + -1;
    uVar10 = uVar12 >> 0x10;
  } while (bVar17);
  if (0xffff < uVar12) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                  ,0x79c,
                  "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                 );
  }
  lVar7 = 1;
  do {
    uVar14 = uVar8;
    b_u16n[lVar7] = (uint16_t)uVar14;
    bVar17 = lVar7 != 0;
    lVar7 = lVar7 + -1;
    uVar8 = uVar14 >> 0x10;
  } while (bVar17);
  if (0xffff < (uint)uVar14) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                  ,0x7a0,
                  "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                 );
  }
  _Var1 = mul_u16n(sr_u16n,a_u16n,b_u16n,4,2,2);
  if (_Var1) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                  ,0x7a5,
                  "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                 );
  }
  lVar7 = 1;
  do {
    uVar8 = uVar11;
    a_u16n[lVar7] = (uint16_t)uVar8;
    bVar17 = lVar7 != 0;
    lVar7 = lVar7 + -1;
    uVar11 = uVar8 >> 0x10;
  } while (bVar17);
  if (0xffff < (uint)uVar8) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                  ,0x7a9,
                  "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                 );
  }
  lVar7 = 1;
  uVar10 = b->n;
  do {
    uVar12 = uVar10;
    b_u16n[lVar7] = (uint16_t)uVar12;
    bVar17 = lVar7 != 0;
    lVar7 = lVar7 + -1;
    uVar10 = uVar12 >> 0x10;
  } while (bVar17);
  if (0xffff < uVar12) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                  ,0x7ad,
                  "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                 );
  }
  _Var1 = mul_u16n(n_u16n + 1,a_u16n,b_u16n,4,2,2);
  if (_Var1) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                  ,0x7b2,
                  "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                 );
  }
  n_u16n[0] = addip_u16n(n_u16n + 1,sr_u16n,4,4);
  lVar7 = 1;
  uVar10 = b->d;
  do {
    uVar12 = uVar10;
    b_u16n[lVar7] = (uint16_t)uVar12;
    bVar17 = lVar7 != 0;
    lVar7 = lVar7 + -1;
    uVar10 = uVar12 >> 0x10;
  } while (bVar17);
  if (0xffff < uVar12) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                  ,0x7b8,
                  "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                 );
  }
  _Var1 = mul_u16n(d_u16n,a_u16n,b_u16n,4,2,2);
  if (_Var1) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                  ,0x7bd,
                  "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                 );
  }
  wVar2 = div_u16n(q_u16n,r_u16n,w_u16n,n_u16n,d_u16n,2,5,4);
  uVar13 = 0xffffffff;
  uVar10 = 1;
  if ((wVar2 == L'\0') && (sVar3 = msb_u16n(q_u16n,2), sVar3 < 0x21)) {
    puVar4 = q_u16n + 1;
    iVar15 = 0;
    lVar7 = 0;
    do {
      iVar15 = iVar15 + ((uint)*puVar4 << ((byte)lVar7 & 0x1f));
      puVar4 = puVar4 + -1;
      bVar17 = lVar7 != 0x10;
      lVar7 = lVar7 + 0x10;
    } while (bVar17);
    if (iVar15 == -1) {
      uVar11 = 1;
    }
    else {
      uVar11 = 0xffffffff / (ulong)(iVar15 + 1);
    }
    lVar7 = 1;
    uVar10 = (uint)uVar11;
    do {
      uVar8 = uVar11;
      a_u16n[lVar7] = (uint16_t)uVar8;
      bVar17 = lVar7 != 0;
      lVar7 = lVar7 + -1;
      uVar11 = uVar8 >> 0x10;
    } while (bVar17);
    if (0xffff < (uint)uVar8) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x7ce,
                    "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var1 = mul_u16n(sr_u16n,r_u16n,a_u16n,7,5,2);
    if (_Var1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x7d4,
                    "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                   );
    }
    wVar2 = div_u16n(q_u16n,rr_u16n,w_u16n,sr_u16n,d_u16n,2,7,4);
    if (wVar2 != L'\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x7da,
                    "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                   );
    }
    sVar3 = msb_u16n(q_u16n,2);
    if (0x20 < sVar3) {
      __assert_fail("msb_u16n(q_u16n, MP_DIGITS) <= sizeof(unsigned int) * CHAR_BIT",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x7dd,
                    "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                   );
    }
    puVar4 = q_u16n + 1;
    uVar12 = 0;
    lVar7 = 0;
    do {
      uVar12 = uVar12 + ((uint)*puVar4 << ((byte)lVar7 & 0x1f));
      puVar4 = puVar4 + -1;
      bVar17 = lVar7 != 0x10;
      lVar7 = lVar7 + 0x10;
    } while (bVar17);
    iVar16 = uVar12 + iVar15 * uVar10;
    if (CARRY4(uVar12,iVar15 * uVar10)) {
      if (uVar10 != 1) {
        __assert_fail("resd == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x7e9,
                      "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                     );
      }
    }
    else {
      sVar3 = msb_u16n(rr_u16n,7);
      sVar5 = msb_u16n(d_u16n,4);
      uVar13 = (uint)(iVar16 != -1 && sVar5 <= sVar3 + 1) + iVar16;
    }
  }
LAB_001fcc6f:
  mVar6 = my_rational_construct(uVar13,uVar10);
  return mVar6;
}

Assistant:

struct my_rational my_rational_sum(const struct my_rational *a,
		const struct my_rational *b)
{
	unsigned int g = gcd(a->d, b->d);
	unsigned int adr = a->d / g, bdr = b->d / g;
	unsigned int resn, resd;

	if (adr <= UINT_MAX / b->d
			&& a->n <= UINT_MAX / bdr
			&& b->n <= UINT_MAX / adr
			&& a->n * bdr <= UINT_MAX - b->n * adr) {
		resn = a->n * bdr + b->n * adr;
		resd = adr * b->d;
	} else {
		/* Overflows in native arithmetic so approximate. */
#define MP_DIGITS ((sizeof(unsigned int) + (sizeof(uint16_t) - 1)) / sizeof(uint16_t))
		uint16_t a_u16n[MP_DIGITS], b_u16n[MP_DIGITS];
		uint16_t n_u16n[2 * MP_DIGITS + 1], d_u16n[2 * MP_DIGITS];
		uint16_t q_u16n[MP_DIGITS], r_u16n[2 * MP_DIGITS + 1];
		uint16_t sr_u16n[3 * MP_DIGITS + 1], rr_u16n[3 * MP_DIGITS + 1];
		uint16_t w_u16n[2 * MP_DIGITS + 1];
		bool over;

		over = ini_u16n(a_u16n, MP_DIGITS, a->n);
		if (over) {
			assert(0);
		}
		over = ini_u16n(b_u16n, MP_DIGITS, bdr);
		if (over) {
			assert(0);
		}
		over = mul_u16n(sr_u16n, a_u16n, b_u16n, 2 * MP_DIGITS,
			MP_DIGITS, MP_DIGITS);
		if (over) {
			assert(0);
		}
		over = ini_u16n(a_u16n, MP_DIGITS, adr);
		if (over) {
			assert(0);
		}
		over = ini_u16n(b_u16n, MP_DIGITS, b->n);
		if (over) {
			assert(0);
		}
		over = mul_u16n(n_u16n + 1, a_u16n, b_u16n, 2 * MP_DIGITS,
			MP_DIGITS, MP_DIGITS);
		if (over) {
			assert(0);
		}
		n_u16n[0] = addip_u16n(n_u16n + 1, sr_u16n, 2 * MP_DIGITS,
			2 * MP_DIGITS);
		over = ini_u16n(b_u16n, MP_DIGITS, b->d);
		if (over) {
			assert(0);
		}
		over = mul_u16n(d_u16n, a_u16n, b_u16n, 2 * MP_DIGITS,
			MP_DIGITS, MP_DIGITS);
		if (over) {
			assert(0);
		}
		over = (div_u16n(q_u16n, r_u16n, w_u16n, n_u16n, d_u16n,
			MP_DIGITS, 2 * MP_DIGITS + 1, 2 * MP_DIGITS) != 0);
		if (!over && msb_u16n(q_u16n, MP_DIGITS)
				<= sizeof(unsigned int) * CHAR_BIT) {
			unsigned int t;

			resn = ext_u16n(q_u16n, MP_DIGITS);
			/*
			 * Use as large as a numerator as possible so the
			 * approximation is as accurate as possible.
			 */
			resd = (resn < UINT_MAX) ? UINT_MAX / (resn + 1) : 1;
			resn *= resd;
			over = ini_u16n(a_u16n, MP_DIGITS, resd);
			if (over) {
				assert(0);
			}
			over = mul_u16n(sr_u16n, r_u16n, a_u16n,
				3 * MP_DIGITS + 1, 2 * MP_DIGITS + 1,
				MP_DIGITS);
			if (over) {
				assert(0);
			}
			over = (div_u16n(q_u16n, rr_u16n, w_u16n, sr_u16n,
				d_u16n, MP_DIGITS, 3 * MP_DIGITS + 1,
				2 * MP_DIGITS) != 0);
			if (over) {
				assert(0);
			}
			assert(msb_u16n(q_u16n, MP_DIGITS)
				<= sizeof(unsigned int) * CHAR_BIT);
			t = ext_u16n(q_u16n, MP_DIGITS);
			if (resn <= UINT_MAX - t) {
				resn += t;
				/* Approximate rounding to the nearest. */
				if (msb_u16n(rr_u16n, 3 * MP_DIGITS + 1) + 1
						>= msb_u16n(d_u16n,
						2 * MP_DIGITS)
						&& resn < UINT_MAX) {
					++resn;
				}
			} else {
				assert(resd == 1);
				resn = UINT_MAX;
			}
		} else {
			resn = UINT_MAX;
			resd = 1;
		}
#undef MP_DIGITS
	}
	return my_rational_construct(resn, resd);
}